

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int IDisk::CompareForSync(uchar *src,uchar *src2,int size)

{
  int local_30;
  int local_2c;
  int i_1;
  int i;
  int found;
  int size_local;
  uchar *src2_local;
  uchar *src_local;
  
  i_1 = 0;
  for (local_2c = 1; local_2c < size; local_2c = local_2c + 2) {
    if (src[local_2c] != src2[local_2c]) {
      i_1 = -1;
      break;
    }
  }
  if (i_1 == 0) {
    src_local._4_4_ = i_1;
  }
  else {
    i_1 = 1;
    for (local_30 = 1; local_30 < size; local_30 = local_30 + 2) {
      if ((src[local_30] != src2[local_30 + -1]) && ((1 < local_30 || (src2[local_30] == '\x01'))))
      {
        i_1 = -1;
        break;
      }
    }
    src_local._4_4_ = i_1;
  }
  return src_local._4_4_;
}

Assistant:

int IDisk::CompareForSync(unsigned char* src, unsigned char* src2, int size)
{
   int found = 0;

   // Src is from unsafe source : It can be :
   // - Shiffted
   // - incomplete (only one bit every 2 MFM bit is stored - It can be data or clock bit)
   for (int i = 1; i < size; i += 2)
   {
      // Add this : 10 == 00
      // Only check data bit (no clock bit)
      if (src[i] != src2[i])
      {
         found = -1;
         break;
      }
   }

   if (found == 0)
      return found;

   found = 1;
   for (int i = 1; i < size; i += 2)
   {
      // Now, check clock bit (maybe it's the one that is stored)
      if ((src[i] != src2[i - 1]) && (i > 1 || src2[i] == 1))
      {
         found = -1;
         break;
      }
   }
   return found;
}